

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

string * __thiscall
EventDataType::getOrigin_abi_cxx11_(string *__return_storage_ptr__,EventDataType *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->origin);
  return __return_storage_ptr__;
}

Assistant:

std::string EventDataType::getOrigin() const{
    return origin;
}